

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Optimizer.cpp
# Opt level: O0

bool __thiscall
calc4::anon_unknown_23::PrecomputeVisitor<long>::TryGetPrecomputedValue
          (PrecomputeVisitor<long> *this,shared_ptr<const_calc4::Operator> *op,long *dest)

{
  bool bVar1;
  long *plVar2;
  long *in_RDX;
  shared_ptr<const_calc4::PrecomputedOperator> precomputed;
  __shared_ptr local_30 [8];
  shared_ptr<const_calc4::Operator> *in_stack_ffffffffffffffd8;
  
  std::dynamic_pointer_cast<calc4::PrecomputedOperator_const,calc4::Operator_const>
            (in_stack_ffffffffffffffd8);
  bVar1 = std::__shared_ptr::operator_cast_to_bool(local_30);
  if (bVar1) {
    std::
    __shared_ptr_access<const_calc4::PrecomputedOperator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<const_calc4::PrecomputedOperator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x140eac);
    plVar2 = PrecomputedOperator::GetValue<long>((PrecomputedOperator *)0x140eb4);
    *in_RDX = *plVar2;
  }
  std::shared_ptr<const_calc4::PrecomputedOperator>::~shared_ptr
            ((shared_ptr<const_calc4::PrecomputedOperator> *)0x140f09);
  return bVar1;
}

Assistant:

bool TryGetPrecomputedValue(const std::shared_ptr<const Operator>& op, TNumber* dest)
    {
        if (auto precomputed = std::dynamic_pointer_cast<const PrecomputedOperator>(op))
        {
            *dest = precomputed->GetValue<TNumber>();
            return true;
        }
        else
        {
            return false;
        }
    }